

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterSetIndentString(xmlTextWriterPtr writer,xmlChar *str)

{
  xmlChar *pxVar1;
  xmlChar *str_local;
  xmlTextWriterPtr writer_local;
  
  if ((writer == (xmlTextWriterPtr)0x0) || (str == (xmlChar *)0x0)) {
    writer_local._4_4_ = -1;
  }
  else {
    if (writer->ichar != (xmlChar *)0x0) {
      (*xmlFree)(writer->ichar);
    }
    pxVar1 = xmlStrdup(str);
    writer->ichar = pxVar1;
    if (writer->ichar == (xmlChar *)0x0) {
      writer_local._4_4_ = -1;
    }
    else {
      writer_local._4_4_ = 0;
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterSetIndentString(xmlTextWriterPtr writer, const xmlChar * str)
{
    if ((writer == NULL) || (!str))
        return -1;

    if (writer->ichar != NULL)
        xmlFree(writer->ichar);
    writer->ichar = xmlStrdup(str);

    if (!writer->ichar)
        return -1;
    else
        return 0;
}